

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
duckdb::StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
          (string *fmt_str,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params
          ,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1)

{
  string *in_RCX;
  string *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  string *in_stack_00000008;
  string local_60 [32];
  string local_40 [56];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1_00;
  
  params_1_00 = in_RDI;
  std::__cxx11::string::string(local_40,in_RDX);
  std::__cxx11::string::string(local_60,in_RCX);
  Exception::ConstructMessage<std::__cxx11::string,std::__cxx11::string>
            (in_stack_00000008,unaff_retaddr,params_1_00);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_40);
  return in_RDI;
}

Assistant:

static string Format(const string fmt_str, ARGS... params) {
		return Exception::ConstructMessage(fmt_str, params...);
	}